

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_calc_fontwidth(t_my_numbox *x)

{
  ulong uVar1;
  int local_18;
  int f;
  int w;
  t_my_numbox *x_local;
  
  local_18 = 0x1f;
  if (((uint)(x->x_gui).x_fsf & 0x3f) == 1) {
    local_18 = 0x1b;
  }
  else if (((uint)(x->x_gui).x_fsf & 0x3f) == 2) {
    local_18 = 0x19;
  }
  uVar1 = (long)(x->x_gui).x_h / 2;
  (x->x_gui).x_w =
       (((x->x_gui).x_fontsize * local_18 * x->x_numwidth) / 0x24 +
        (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
             (long)((x->x_gui).x_glist)->gl_zoom) + 4) * ((x->x_gui).x_glist)->gl_zoom;
  return;
}

Assistant:

void my_numbox_calc_fontwidth(t_my_numbox *x)
{
    int w, f = 31;

    if(x->x_gui.x_fsf.x_font_style == 1)
        f = 27;
    else if(x->x_gui.x_fsf.x_font_style == 2)
        f = 25;

    w = x->x_gui.x_fontsize * f * x->x_numwidth;
    w /= 36;
    x->x_gui.x_w = (w + (x->x_gui.x_h/2)/IEMGUI_ZOOM(x) + 4) * IEMGUI_ZOOM(x);
}